

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGCheckReference(void *payload,void *data,xmlChar *name)

{
  long lVar1;
  void *pvVar2;
  void *local_48;
  xmlRelaxNGDefinePtr_conflict cur;
  xmlRelaxNGDefinePtr_conflict def;
  xmlRelaxNGGrammarPtr_conflict grammar;
  xmlRelaxNGParserCtxtPtr ctxt;
  xmlRelaxNGDefinePtr_conflict ref;
  xmlChar *name_local;
  void *data_local;
  void *payload_local;
  
  if ((*(ushort *)((long)payload + 0x62) & 0x100) == 0) {
    lVar1 = *(long *)((long)data + 0x30);
    if (lVar1 == 0) {
      xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),1,
                 "Internal error: no grammar in CheckReference %s\n",name,(xmlChar *)0x0);
    }
    else if (*(long *)((long)payload + 0x30) == 0) {
      if (*(long *)(lVar1 + 0x30) == 0) {
        xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x44d,
                   "Reference %s has no matching definition\n",name,(xmlChar *)0x0);
      }
      else {
        pvVar2 = xmlHashLookup(*(xmlHashTablePtr *)(lVar1 + 0x30),name);
        local_48 = payload;
        if (pvVar2 == (void *)0x0) {
          xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x44d,
                     "Reference %s has no matching definition\n",name,(xmlChar *)0x0);
        }
        else {
          for (; local_48 != (void *)0x0; local_48 = *(void **)((long)local_48 + 0x58)) {
            *(void **)((long)local_48 + 0x30) = pvVar2;
          }
        }
      }
    }
    else {
      xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),1,
                 "Internal error: reference has content in CheckReference %s\n",name,(xmlChar *)0x0)
      ;
    }
  }
  return;
}

Assistant:

static void
xmlRelaxNGCheckReference(void *payload, void *data, const xmlChar * name)
{
    xmlRelaxNGDefinePtr ref = (xmlRelaxNGDefinePtr) payload;
    xmlRelaxNGParserCtxtPtr ctxt = (xmlRelaxNGParserCtxtPtr) data;
    xmlRelaxNGGrammarPtr grammar;
    xmlRelaxNGDefinePtr def, cur;

    /*
     * Those rules don't apply to imported ref from xmlRelaxNGParseImportRef
     */
    if (ref->dflags & IS_EXTERNAL_REF)
        return;

    grammar = ctxt->grammar;
    if (grammar == NULL) {
        xmlRngPErr(ctxt, ref->node, XML_ERR_INTERNAL_ERROR,
                   "Internal error: no grammar in CheckReference %s\n",
                   name, NULL);
        return;
    }
    if (ref->content != NULL) {
        xmlRngPErr(ctxt, ref->node, XML_ERR_INTERNAL_ERROR,
                   "Internal error: reference has content in CheckReference %s\n",
                   name, NULL);
        return;
    }
    if (grammar->defs != NULL) {
        def = xmlHashLookup(grammar->defs, name);
        if (def != NULL) {
            cur = ref;
            while (cur != NULL) {
                cur->content = def;
                cur = cur->nextHash;
            }
        } else {
            xmlRngPErr(ctxt, ref->node, XML_RNGP_REF_NO_DEF,
                       "Reference %s has no matching definition\n", name,
                       NULL);
        }
    } else {
        xmlRngPErr(ctxt, ref->node, XML_RNGP_REF_NO_DEF,
                   "Reference %s has no matching definition\n", name,
                   NULL);
    }
}